

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# profiler_unittest.cc
# Opt level: O3

int main(int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  __pid_t _Var3;
  
  if (argc < 2) {
    main_cold_1();
LAB_0010149a:
    iVar2 = 1;
  }
  else {
    g_iters = atoi(argv[1]);
    iVar2 = 1;
    bVar1 = true;
    if (((argc != 2) && (iVar2 = atoi(argv[2]), 3 < (uint)argc)) && (argv[3] != (char *)0x0)) {
      ProfilerStart();
      bVar1 = false;
    }
    test_main_thread();
    ProfilerFlush();
    if (iVar2 < 1) {
      if (iVar2 < 0) {
        if (!bVar1) {
          puts("FORK test only makes sense when no filename is specified.");
          return 2;
        }
        do {
          _Var3 = fork();
          if (_Var3 == -1) {
            puts("FORK failed!");
            goto LAB_0010149a;
          }
          if (_Var3 == 0) {
            iVar2 = execl(*argv,*argv,argv[1],0);
            return iVar2;
          }
          wait((void *)0x0);
          iVar2 = iVar2 + 1;
        } while (iVar2 != 0);
      }
    }
    else {
      RunManyThreads(test_other_thread,iVar2);
    }
    test_main_thread();
    iVar2 = 0;
    if (!bVar1) {
      ProfilerStop();
      iVar2 = 0;
    }
  }
  return iVar2;
}

Assistant:

int main(int argc, char** argv) {
  if ( argc <= 1 ) {
    fprintf(stderr, "USAGE: %s <iters> [num_threads] [filename]\n", argv[0]);
    fprintf(stderr, "   iters: How many million times to run the XOR test.\n");
    fprintf(stderr, "   num_threads: how many concurrent threads.\n");
    fprintf(stderr, "                0 or 1 for single-threaded mode,\n");
    fprintf(stderr, "                -# to fork instead of thread.\n");
    fprintf(stderr, "   filename: The name of the output profile.\n");
    fprintf(stderr, ("             If you don't specify, set CPUPROFILE "
                     "in the environment instead!\n"));
    return 1;
  }

  g_iters = atoi(argv[1]);
  int num_threads = 1;
  const char* filename = nullptr;
  if (argc > 2) {
    num_threads = atoi(argv[2]);
  }
  if (argc > 3) {
    filename = argv[3];
  }

  if (filename) {
    ProfilerStart(filename);
  }

  test_main_thread();

  ProfilerFlush();                           // just because we can

  // The other threads, if any, will run only half as long as the main thread
  if(num_threads > 0) {
    RunManyThreads(test_other_thread, num_threads);
  } else {
  // Or maybe they asked to fork.  The fork test is only interesting
  // when we use CPUPROFILE to name, so check for that
#ifdef HAVE_UNISTD_H
    for (; num_threads < 0; ++num_threads) {   // -<num_threads> to fork
      if (filename) {
        printf("FORK test only makes sense when no filename is specified.\n");
        return 2;
      }
      switch (fork()) {
        case -1:
          printf("FORK failed!\n");
          return 1;
        case 0:             // child
          return execl(argv[0], argv[0], argv[1], nullptr);
        default:
          wait(nullptr);       // we'll let the kids run one at a time
      }
    }
#else
    fprintf(stderr, "%s was compiled without support for fork() and exec()\n", argv[0]);
#endif
  }

  test_main_thread();

  if (filename) {
    ProfilerStop();
  }

  return 0;
}